

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  bool local_199;
  undefined1 local_198 [7];
  bool first;
  ostringstream stream;
  bool useBranch_local;
  Operation *operations_local;
  
  stream._375_1_ = (byte)operations & 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  local_199 = (*(uint *)this & 4) != 0;
  if (local_199) {
    std::operator<<((ostream *)local_198,"get");
  }
  local_199 = !local_199;
  if ((*(uint *)this & 1) != 0) {
    if (!local_199) {
      std::operator<<((ostream *)local_198,"_");
    }
    std::operator<<((ostream *)local_198,"inc");
    local_199 = false;
  }
  if ((*(uint *)this & 2) != 0) {
    if (!local_199) {
      std::operator<<((ostream *)local_198,"_");
    }
    std::operator<<((ostream *)local_198,"dec");
  }
  if ((stream._375_1_ & 1) != 0) {
    std::operator<<((ostream *)local_198,"_branch");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string operationToName (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				first = true;

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "get";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "inc";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "dec";
		first = false;
	}

	if (useBranch)
		stream << "_branch";

	return stream.str();
}